

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

urlencode * __thiscall cppcms::filters::urlencode::operator=(urlencode *this,urlencode *other)

{
  urlencode *puVar1;
  
  puVar1 = (urlencode *)streamable::operator=(&this->obj_,&other->obj_);
  return puVar1;
}

Assistant:

urlencode const &urlencode::operator=(urlencode const &other){ obj_ = other.obj_; return *this; }